

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Abc_Obj_t * Abc_SclPerformBufferingOne(Abc_Obj_t *pObj,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Abc_Obj_t *pFaninNew;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  
  iVar1 = (pObj->vFanouts).nSize;
  if (iVar1 <= Degree) {
    __assert_fail("Abc_ObjFanoutNum(pObj) > Degree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                  ,0x172,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
  uVar11 = (ulong)(uint)Degree;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar4 << 3);
  }
  vNodes->pArray = ppvVar2;
  Abc_NodeCollectFanouts(pObj,vNodes);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_NodeCompareLevels);
  }
  if (fUseInvs == 0) {
    pFaninNew = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  else {
    pFaninNew = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  uVar5 = vNodes->nSize;
  if (Degree * 2 <= (int)uVar5) goto LAB_003c5736;
  uVar8 = ~Degree + uVar5;
  if ((((int)uVar8 < 0) || ((int)uVar5 <= (int)uVar8)) || (uVar5 <= Degree - 1U)) {
LAB_003c5893:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar2 = vNodes->pArray;
  uVar6 = *(uint *)((long)ppvVar2[Degree - 1U] + 0x14) >> 0xc;
  if ((uVar6 == *(uint *)((long)ppvVar2[(ulong)uVar5 - 1] + 0x14) >> 0xc) &&
     (*(uint *)((long)ppvVar2[uVar8] + 0x14) >> 0xc < uVar6)) {
    uVar9 = 0;
    while (*(uint *)((long)ppvVar2[uVar9] + 0x14) >> 0xc != uVar6) {
      uVar9 = uVar9 + 1;
      if (uVar5 == uVar9) {
        __assert_fail("i < Vec_PtrSize(vFanouts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                      ,0x189,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
      }
    }
    uVar8 = (uint)uVar9;
    if (uVar9 < 2) {
      uVar8 = Degree;
    }
    if (uVar8 == Degree) goto LAB_003c56f4;
  }
  else {
LAB_003c56f4:
    if (Degree <= (int)(uVar5 - Degree)) goto LAB_003c5736;
    uVar8 = (uVar5 & 1) + (uVar5 >> 1);
  }
  uVar11 = (ulong)uVar8;
  if (Degree < (int)uVar8) {
    __assert_fail("Degree <= Degree0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                  ,400,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
LAB_003c5736:
  if (0 < (int)uVar11) {
    uVar9 = 0;
    do {
      if ((long)vNodes->nSize <= (long)uVar9) goto LAB_003c5893;
      Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[uVar9],pObj,pFaninNew);
      uVar9 = uVar9 + 1;
    } while (uVar11 != uVar9);
  }
  if (fVerbose != 0) {
    printf("%5d : ",(ulong)(uint)pObj->Id);
    if (0 < vNodes->nSize) {
      uVar9 = 0;
      do {
        pcVar7 = "";
        if ((int)uVar11 - 1 == uVar9) {
          pcVar7 = "  ";
        }
        printf("%d%s ",(ulong)(*(uint *)((long)vNodes->pArray[uVar9] + 0x14) >> 0xc),pcVar7);
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)vNodes->nSize);
    }
    putchar(10);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  Abc_ObjAddFanin(pFaninNew,pObj);
  lVar3 = (long)(pFaninNew->vFanouts).nSize;
  if (lVar3 < 1) {
    uVar5 = 0x1000;
  }
  else {
    lVar10 = 0;
    uVar5 = 0;
    do {
      uVar8 = *(uint *)((long)pFaninNew->pNtk->vObjs->pArray[(pFaninNew->vFanouts).pArray[lVar10]] +
                       0x14) >> 0xc;
      if (uVar8 < uVar5) {
        uVar8 = uVar5;
      }
      uVar5 = uVar8;
      lVar10 = lVar10 + 1;
    } while (lVar3 != lVar10);
    uVar5 = uVar5 * 0x1000 + 0x1000;
  }
  *(uint *)&pFaninNew->field_0x14 = *(uint *)&pFaninNew->field_0x14 & 0xfff | uVar5;
  if (fUseInvs != 0) {
    Abc_NodeInvUpdateFanPolarity(pFaninNew);
  }
  return pFaninNew;
}

Assistant:

Abc_Obj_t * Abc_SclPerformBufferingOne( Abc_Obj_t * pObj, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer, * pFanout;
    int i, Degree0 = Degree;
    assert( Abc_ObjFanoutNum(pObj) > Degree );
    // collect fanouts and sort by reverse level
    vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
    Abc_NodeCollectFanouts( pObj, vFanouts );
    Vec_PtrSort( vFanouts, (int (*)(void))Abc_NodeCompareLevels );
    // select the first Degree fanouts
    if ( fUseInvs )
        pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
    else
        pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
    // check if it is possible to not increase level
    if ( Vec_PtrSize(vFanouts) < 2 * Degree )
    {
        Abc_Obj_t * pFanPrev = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Vec_PtrSize(vFanouts)-1-Degree);
        Abc_Obj_t * pFanThis = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Degree-1);
        Abc_Obj_t * pFanLast = (Abc_Obj_t *)Vec_PtrEntryLast(vFanouts);
        if ( Abc_ObjLevel(pFanThis) == Abc_ObjLevel(pFanLast) &&
             Abc_ObjLevel(pFanPrev) <  Abc_ObjLevel(pFanThis) )
        {
            // find the first one whose level is the same as last
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
                if ( Abc_ObjLevel(pFanout) == Abc_ObjLevel(pFanLast) )
                    break;
            assert( i < Vec_PtrSize(vFanouts) );
            if ( i > 1 )
                Degree = i;
        }
        // make the last two more well-balanced
        if ( Degree == Degree0 && Degree > Vec_PtrSize(vFanouts) - Degree )
            Degree = Vec_PtrSize(vFanouts)/2 + (Vec_PtrSize(vFanouts) & 1);
        assert( Degree <= Degree0 );
    }
    // select fanouts
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Degree )
        Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
    if ( fVerbose )
    {
        printf( "%5d : ", Abc_ObjId(pObj) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            printf( "%d%s ", Abc_ObjLevel(pFanout), i == Degree-1 ? "  " : "" );
        printf( "\n" );
    }
    Vec_PtrFree( vFanouts );
    Abc_ObjAddFanin( pBuffer, pObj );
    pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
    if ( fUseInvs )
        Abc_NodeInvUpdateFanPolarity( pBuffer );
    return pBuffer;
}